

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_normalize(secp256k1_fe *r)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uchar *a;
  ulong uVar5;
  secp256k1_fe *a_00;
  secp256k1_fe *buf;
  ulong uVar6;
  undefined1 *puVar7;
  secp256k1_fe *psVar8;
  ulong uVar9;
  secp256k1_fe sStack_e0;
  secp256k1_ge sStack_b0;
  undefined1 *puStack_48;
  secp256k1_fe *psStack_40;
  
  secp256k1_fe_verify(r);
  uVar4 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar5 = (uVar4 >> 0x34) + r->n[1];
  uVar2 = (uVar5 >> 0x34) + r->n[2];
  uVar6 = uVar2 & 0xfffffffffffff;
  uVar2 = (uVar2 >> 0x34) + r->n[3];
  uVar3 = (uVar2 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar4 = uVar4 & 0xfffffffffffff;
  uVar9 = (ulong)(0xffffefffffc2e < uVar4 &&
                 ((uVar6 & uVar5 & uVar2) == 0xfffffffffffff && uVar3 == 0xffffffffffff)) |
          uVar3 >> 0x30;
  uVar4 = uVar9 * 0x1000003d1 + uVar4;
  uVar5 = (uVar4 >> 0x34) + (uVar5 & 0xfffffffffffff);
  a_00 = (secp256k1_fe *)((uVar5 >> 0x34) + uVar6);
  puVar7 = (undefined1 *)(((ulong)a_00 >> 0x34) + (uVar2 & 0xfffffffffffff));
  uVar3 = ((ulong)puVar7 >> 0x34) + uVar3;
  if ((uint)(ushort)(uVar3 >> 0x30) == (uint)uVar9) {
    r->n[0] = uVar4 & 0xfffffffffffff;
    r->n[1] = uVar5 & 0xfffffffffffff;
    r->n[2] = (ulong)a_00 & 0xfffffffffffff;
    r->n[3] = (ulong)puVar7 & 0xfffffffffffff;
    r->n[4] = uVar3 & 0xffffffffffff;
    r->magnitude = 1;
    r->normalized = 1;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_normalize_cold_1();
  buf = a_00;
  psVar8 = a_00;
  secp256k1_fe_verify(a_00);
  if (a_00->normalized != 0) {
    *puVar7 = *(undefined1 *)((long)a_00->n + 0x25);
    puVar7[1] = *(undefined1 *)((long)a_00->n + 0x24);
    puVar7[2] = *(undefined1 *)((long)a_00->n + 0x23);
    puVar7[3] = *(undefined1 *)((long)a_00->n + 0x22);
    puVar7[4] = *(undefined1 *)((long)a_00->n + 0x21);
    puVar7[5] = (char)a_00->n[4];
    puVar7[6] = (char)(a_00->n[3] >> 0x2c);
    puVar7[7] = (char)(a_00->n[3] >> 0x24);
    puVar7[8] = (char)(a_00->n[3] >> 0x1c);
    puVar7[9] = (char)((uint)a_00->n[3] >> 0x14);
    puVar7[10] = (char)((uint)a_00->n[3] >> 0xc);
    puVar7[0xb] = (char)((uint)a_00->n[3] >> 4);
    puVar7[0xc] = (byte)((int)a_00->n[3] << 4) | (byte)*(undefined2 *)((long)a_00->n + 0x16) & 0xf;
    puVar7[0xd] = *(undefined1 *)((long)a_00->n + 0x15);
    puVar7[0xe] = *(undefined1 *)((long)a_00->n + 0x14);
    puVar7[0xf] = *(undefined1 *)((long)a_00->n + 0x13);
    puVar7[0x10] = *(undefined1 *)((long)a_00->n + 0x12);
    puVar7[0x11] = *(undefined1 *)((long)a_00->n + 0x11);
    puVar7[0x12] = (char)a_00->n[2];
    puVar7[0x13] = (char)(a_00->n[1] >> 0x2c);
    puVar7[0x14] = (char)(a_00->n[1] >> 0x24);
    puVar7[0x15] = (char)(a_00->n[1] >> 0x1c);
    puVar7[0x16] = (char)((uint)a_00->n[1] >> 0x14);
    puVar7[0x17] = (char)((uint)a_00->n[1] >> 0xc);
    puVar7[0x18] = (char)((uint)a_00->n[1] >> 4);
    puVar7[0x19] = (byte)((int)a_00->n[1] << 4) | (byte)*(undefined2 *)((long)a_00->n + 6) & 0xf;
    puVar7[0x1a] = *(undefined1 *)((long)a_00->n + 5);
    puVar7[0x1b] = *(undefined1 *)((long)a_00->n + 4);
    puVar7[0x1c] = *(undefined1 *)((long)a_00->n + 3);
    puVar7[0x1d] = *(undefined1 *)((long)a_00->n + 2);
    puVar7[0x1e] = *(undefined1 *)((long)a_00->n + 1);
    puVar7[0x1f] = (char)a_00->n[0];
    return;
  }
  secp256k1_fe_get_b32_cold_1();
  puStack_48 = puVar7;
  psStack_40 = a_00;
  if (psVar8 == (secp256k1_fe *)0x0) {
    secp256k1_xonly_pubkey_parse_cold_3();
  }
  else if (buf != (secp256k1_fe *)0x0) {
    buf[1].n[0] = 0;
    buf[1].n[1] = 0;
    buf->n[4] = 0;
    buf->magnitude = 0;
    buf->normalized = 0;
    buf->n[2] = 0;
    buf->n[3] = 0;
    buf->n[0] = 0;
    buf->n[1] = 0;
    if (a == (uchar *)0x0) {
      secp256k1_xonly_pubkey_parse_cold_1();
      return;
    }
    secp256k1_fe_impl_set_b32_mod(&sStack_e0,a);
    if (((0xffffefffffc2e < sStack_e0.n[0]) && (sStack_e0.n[4] == 0xffffffffffff)) &&
       ((sStack_e0.n[2] & sStack_e0.n[3] & sStack_e0.n[1]) == 0xfffffffffffff)) {
      return;
    }
    sStack_e0.magnitude = 1;
    sStack_e0.normalized = 1;
    secp256k1_fe_verify(&sStack_e0);
    iVar1 = secp256k1_ge_set_xo_var(&sStack_b0,&sStack_e0,0);
    if (iVar1 == 0) {
      return;
    }
    iVar1 = secp256k1_ge_is_in_correct_subgroup(&sStack_b0);
    if (iVar1 == 0) {
      return;
    }
    secp256k1_ge_to_bytes((uchar *)buf,&sStack_b0);
    return;
  }
  secp256k1_xonly_pubkey_parse_cold_2();
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize(r);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}